

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O0

void __thiscall UnifiedRegex::TrigramAlphabet::InitTrigramMap(TrigramAlphabet *this)

{
  uint uVar1;
  int local_24;
  int j;
  int t3;
  int t2;
  int t1;
  int i;
  TrigramAlphabet *this_local;
  
  this->input = (char16 *)0x0;
  for (t2 = 0; t2 < 0xdd; t2 = t2 + 1) {
    uVar1 = t2 >> 3 & 7;
    if (((t2 >> 6 < 4) && (uVar1 < 4)) && ((t2 & 7U) < 4)) {
      this->trigramMap[t2] = (char)((t2 >> 6) << 4) + (char)(uVar1 << 2) + (char)(t2 & 7U);
    }
    else {
      this->trigramMap[t2] = 'A';
    }
  }
  for (local_24 = 0; local_24 < 0x40; local_24 = local_24 + 1) {
    this->trigramStarts[local_24].count = 0;
  }
  return;
}

Assistant:

void TrigramAlphabet::InitTrigramMap() {
        input=NULL;
        // set up mapping from 9 bits to trigram
        for (int i=0;i<TrigramMapSize;i++) {
            int t1=i>>6;
            int t2=(i>>3)&0x7;
            int t3=i&0x7;
            if ((t1>=AlphaCount)||(t2>=AlphaCount)||(t3>=AlphaCount)) {
                trigramMap[i]=TrigramNotInPattern;
            }
            else {
                // number of trigram
                trigramMap[i]=(char)((t1<<4)+(t2<<2)+t3);
            }
        }

        for (int j=0;j<TrigramCount;j++) {
            trigramStarts[j].count=0;
        }
    }